

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::Generate
          (ImmutableServiceGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *buffer;
  Printer *printer_00;
  Context *pCVar1;
  pointer pcVar2;
  ServiceDescriptor *pSVar3;
  ushort *puVar4;
  bool bVar5;
  Nonnull<char_*> pcVar6;
  Options *in_RCX;
  char *pcVar7;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string local_f0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  DescriptorNames local_78;
  ServiceOptions *local_68 [2];
  FeatureSet *local_58 [2];
  long local_48;
  undefined2 local_38;
  
  bVar5 = NestedInFileClass((this->super_ServiceGenerator).descriptor_,true);
  printer_00 = (Printer *)(this->super_ServiceGenerator).descriptor_;
  pCVar1 = this->context_;
  local_80[4] = (pCVar1->options_).opensource_runtime;
  local_80[5] = (pCVar1->options_).annotate_code;
  local_80[0] = (pCVar1->options_).generate_immutable_code;
  local_80[1] = (pCVar1->options_).generate_mutable_code;
  local_80[2] = (pCVar1->options_).generate_shared_code;
  local_80[3] = (pCVar1->options_).enforce_lite;
  pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
  local_78.payload_ = (char *)local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,
             pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
  pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
  local_58[0] = (FeatureSet *)&stack0xffffffffffffffb8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar2,pcVar2 + (pCVar1->options_).output_list_file._M_string_length
            );
  local_38._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
  local_38._1_1_ = (pCVar1->options_).jvm_dsl;
  WriteServiceDocComment((java *)printer,printer_00,(ServiceDescriptor *)local_80,in_RCX);
  if (local_58[0] != (FeatureSet *)&stack0xffffffffffffffb8) {
    operator_delete(local_58[0],local_48 + 1);
  }
  if ((ServiceOptions **)local_78.payload_ != local_68) {
    operator_delete(local_78.payload_,
                    (ulong)((long)&(local_68[0]->super_Message).super_MessageLite._vptr_MessageLite
                           + 1));
  }
  pSVar3 = (this->super_ServiceGenerator).descriptor_;
  pCVar1 = this->context_;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  pcVar7 = anon_var_dwarf_a12c75 + 5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,anon_var_dwarf_a12c75 + 5,anon_var_dwarf_a12c75 + 5);
  MaybePrintGeneratedAnnotation<google::protobuf::ServiceDescriptor_const>
            (pCVar1,printer,pSVar3,true,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((this->context_->options_).opensource_runtime == false) {
    text._M_str = "@com.google.protobuf.Internal.ProtoNonnullApi\n";
    text._M_len = 0x2e;
    io::Printer::Print<>(printer,text);
  }
  if (bVar5) {
    pcVar7 = "static";
  }
  puVar4 = (ushort *)(((this->super_ServiceGenerator).descriptor_)->all_names_).payload_;
  local_f0._M_dataplus._M_p = (pointer)(ulong)*puVar4;
  local_f0._M_string_length = (long)puVar4 + ~(ulong)local_f0._M_dataplus._M_p;
  text_00._M_str =
       "public $static$ abstract class $classname$\n    implements com.google.protobuf.Service {\n";
  text_00._M_len = 0x58;
  local_c0._M_dataplus._M_p = pcVar7;
  io::Printer::
  Print<char[7],char_const*,char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_00,(char (*) [7])"static",(char **)&local_c0,(char (*) [10])0x134d25a,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_f0);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  puVar4 = (ushort *)(((this->super_ServiceGenerator).descriptor_)->all_names_).payload_;
  local_f0._M_dataplus._M_p = (pointer)(ulong)*puVar4;
  local_f0._M_string_length = (long)puVar4 + ~(ulong)local_f0._M_dataplus._M_p;
  text_01._M_str = "protected $classname$() {}\n\n";
  text_01._M_len = 0x1c;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_01,(char (*) [10])0x134d25a,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_f0);
  GenerateInterface(this,printer);
  GenerateNewReflectiveServiceMethod(this,printer);
  GenerateNewReflectiveBlockingServiceMethod(this,printer);
  GenerateAbstractMethods(this,printer);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_c0,this->name_resolver_,((this->super_ServiceGenerator).descriptor_)->file_,true
            );
  pSVar3 = (this->super_ServiceGenerator).descriptor_;
  buffer = &local_f0.field_2;
  pcVar6 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     ((int32_t)((ulong)((long)pSVar3 - (long)pSVar3->file_->services_) >> 6),
                      buffer->_M_local_buf);
  local_f0._M_dataplus._M_p = pcVar6 + -(long)buffer;
  local_f0._M_string_length = (size_type)buffer;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,buffer,pcVar6);
  text_02._M_str =
       "public static final\n    com.google.protobuf.Descriptors.ServiceDescriptor\n    getDescriptor() {\n  return $file$.getDescriptor().getServices().get($index$);\n}\n"
  ;
  text_02._M_len = 0x9e;
  io::Printer::Print<char[5],std::__cxx11::string,char[6],std::__cxx11::string>
            (printer,text_02,(char (*) [5])0x129adae,&local_c0,(char (*) [6])0x1104a3a,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  text_03._M_str =
       "public final com.google.protobuf.Descriptors.ServiceDescriptor\n    getDescriptorForType() {\n  return getDescriptor();\n}\n"
  ;
  text_03._M_len = 0x78;
  io::Printer::Print<>(printer,text_03);
  GenerateCallMethod(this,printer);
  GenerateGetPrototype(this,REQUEST,printer);
  GenerateGetPrototype(this,RESPONSE,printer);
  GenerateStub(this,printer);
  GenerateBlockingStub(this,printer);
  pcVar7 = (((this->super_ServiceGenerator).descriptor_)->all_names_).payload_;
  local_f0._M_dataplus._M_p = (pointer)(ulong)*(ushort *)(pcVar7 + 2);
  local_f0._M_string_length = (size_type)(pcVar7 + ~(ulong)local_f0._M_dataplus._M_p);
  text_04._M_str = "\n// @@protoc_insertion_point(class_scope:$full_name$)\n";
  text_04._M_len = 0x36;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_04,(char (*) [10])0x13f0d39,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_f0);
  io::Printer::Outdent(printer);
  text_05._M_str = "}\n\n";
  text_05._M_len = 3;
  io::Printer::Print<>(printer,text_05);
  return;
}

Assistant:

void ImmutableServiceGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);
  WriteServiceDocComment(printer, descriptor_, context_->options());
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);
  if (!context_->options().opensource_runtime) {
    printer->Print("@com.google.protobuf.Internal.ProtoNonnullApi\n");
  }

  printer->Print(
      "public $static$ abstract class $classname$\n"
      "    implements com.google.protobuf.Service {\n",
      "static", is_own_file ? "" : "static", "classname", descriptor_->name());
  printer->Indent();

  printer->Print("protected $classname$() {}\n\n", "classname",
                 descriptor_->name());

  GenerateInterface(printer);

  GenerateNewReflectiveServiceMethod(printer);
  GenerateNewReflectiveBlockingServiceMethod(printer);

  GenerateAbstractMethods(printer);

  // Generate getDescriptor() and getDescriptorForType().
  printer->Print(
      "public static final\n"
      "    com.google.protobuf.Descriptors.ServiceDescriptor\n"
      "    getDescriptor() {\n"
      "  return $file$.getDescriptor().getServices().get($index$);\n"
      "}\n",
      "file", name_resolver_->GetImmutableClassName(descriptor_->file()),
      "index", absl::StrCat(descriptor_->index()));
  GenerateGetDescriptorForType(printer);

  // Generate more stuff.
  GenerateCallMethod(printer);
  GenerateGetPrototype(REQUEST, printer);
  GenerateGetPrototype(RESPONSE, printer);
  GenerateStub(printer);
  GenerateBlockingStub(printer);

  // Add an insertion point.
  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n\n");
}